

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

var __thiscall cs_impl::runtime_cs_ext::local_time(runtime_cs_ext *this,vector *args)

{
  any *this_00;
  long lVar1;
  numeric *pnVar2;
  tm *args_00;
  runtime_error *this_01;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  long local_18;
  
  this_00 = (args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar1 = (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)this_00 >> 3;
  if (lVar1 == 1) {
    pnVar2 = any::const_val<cs::numeric>(this_00);
    local_18 = (long)ROUND(*(longdouble *)&pnVar2->data);
    if (pnVar2->type != false) {
      local_18 = (pnVar2->data)._int;
    }
  }
  else {
    if (lVar1 != 0) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::to_string
                (&local_58,
                 (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 3);
      std::operator+(&local_38,"Wrong size of the arguments. Expected 0 or 1, provided ",&local_58);
      cs::runtime_error::runtime_error(this_01,&local_38);
      __cxa_throw(this_01,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
    }
    local_18 = ::time((time_t *)0x0);
  }
  args_00 = localtime(&local_18);
  any::make<tm,tm&>((any *)this,(tm *)args_00);
  return (var)(proxy *)this;
}

Assistant:

var local_time(vector &args)
		{
			std::time_t t;
			switch (args.size()) {
			case 0:
				t = std::time(nullptr);
				return var::make<std::tm>(*std::localtime(&t));
			case 1:
				t = args[0].const_val<numeric>().as_integer();
				return var::make<std::tm>(*std::localtime(&t));
			default:
				throw cs::runtime_error(
				    "Wrong size of the arguments. Expected 0 or 1, provided " + std::to_string(args.size()));
			}
		}